

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hqnx_32_init.cpp
# Opt level: O1

void hqxInit(void)

{
  uint32_t *puVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  puVar1 = (uint32_t *)operator_new__(0x4000000);
  lVar2 = 0;
  RGBtoYUV32 = puVar1;
  do {
    dVar4 = (double)((uint)((ulong)lVar2 >> 0x10) & 0xffff);
    dVar3 = (double)((uint)((ulong)lVar2 >> 8) & 0xff);
    dVar5 = (double)((uint)lVar2 & 0xff);
    puVar1[lVar2] =
         (int)(long)(dVar5 * 0.114 + dVar4 * 0.299 + dVar3 * 0.587) * 0x10000 +
         (int)(long)(dVar5 * 0.5 + dVar4 * -0.169 + dVar3 * -0.331) * 0x100 +
         (int)(long)(dVar3 * -0.419 + dVar5 * -0.081 + dVar4 * 0.5) + 0x8080;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xffffff);
  return;
}

Assistant:

HQX_API void HQX_CALLCONV hqxInit(void)
{
    /* Initalize RGB to YUV lookup table */
    uint32_t c, r, g, b, y, u, v;
	RGBtoYUV32 = new uint32_t[16777216];
    for (c = 0; c < 16777215; c++) {
        r = (c & 0xFF0000) >> 16;
        g = (c & 0x00FF00) >> 8;
        b = c & 0x0000FF;
        y = (uint32_t)(0.299*r + 0.587*g + 0.114*b);
        u = (uint32_t)(-0.169*r - 0.331*g + 0.5*b) + 128;
        v = (uint32_t)(0.5*r - 0.419*g - 0.081*b) + 128;
        RGBtoYUV32[c] = (y << 16) + (u << 8) + v;
    }
}